

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::mergeRuleStatusVals(RBBITableBuilder *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *pvVar4;
  int iVar5;
  int32_t index;
  UVector *pUVar6;
  UVector *pUVar7;
  int index_00;
  int index_01;
  
  pUVar6 = this->fRB->fRuleStatusVals;
  if (pUVar6->count == 0) {
    UVector::addElement(pUVar6,1,this->fStatus);
    UVector::addElement(this->fRB->fRuleStatusVals,0,this->fStatus);
  }
  pUVar6 = this->fDStates;
  if (0 < pUVar6->count) {
    index = 0;
    do {
      pvVar4 = UVector::elementAt(pUVar6,index);
      pUVar6 = *(UVector **)((long)pvVar4 + 0x10);
      if (pUVar6 == (UVector *)0x0) {
        *(undefined4 *)((long)pvVar4 + 0x18) = 0;
      }
      else {
        *(undefined4 *)((long)pvVar4 + 0x18) = 0xffffffff;
        pUVar7 = this->fRB->fRuleStatusVals;
        if (0 < pUVar7->count) {
          index_00 = 0;
          do {
            iVar1 = UVector::elementAti(pUVar7,index_00);
            iVar5 = pUVar6->count;
            iVar2 = UVector::elementAti(this->fRB->fRuleStatusVals,index_00);
            if (iVar5 == iVar2) {
              iVar5 = pUVar6->count;
              if (iVar5 < 1) {
                index_01 = 0;
              }
              else {
                index_01 = 0;
                do {
                  iVar2 = UVector::elementAti(pUVar6,index_01);
                  iVar3 = UVector::elementAti(this->fRB->fRuleStatusVals,index_01 + index_00 + 1);
                  iVar5 = pUVar6->count;
                  if (iVar2 != iVar3) break;
                  index_01 = index_01 + 1;
                } while (index_01 < iVar5);
              }
              if (index_01 == iVar5) {
                *(int *)((long)pvVar4 + 0x18) = index_00;
                goto LAB_0029a9cb;
              }
            }
            index_00 = index_00 + iVar1 + 1;
            pUVar7 = this->fRB->fRuleStatusVals;
          } while (index_00 < pUVar7->count);
          index_00 = *(int *)((long)pvVar4 + 0x18);
LAB_0029a9cb:
          if (index_00 != -1) goto LAB_0029aa28;
        }
        pUVar7 = this->fRB->fRuleStatusVals;
        *(int32_t *)((long)pvVar4 + 0x18) = pUVar7->count;
        UVector::addElement(pUVar7,pUVar6->count,this->fStatus);
        if (0 < pUVar6->count) {
          iVar1 = 0;
          do {
            pUVar7 = this->fRB->fRuleStatusVals;
            iVar2 = UVector::elementAti(pUVar6,iVar1);
            UVector::addElement(pUVar7,iVar2,this->fStatus);
            iVar1 = iVar1 + 1;
          } while (iVar1 < pUVar6->count);
        }
      }
LAB_0029aa28:
      index = index + 1;
      pUVar6 = this->fDStates;
    } while (index < pUVar6->count);
  }
  return;
}

Assistant:

void  RBBITableBuilder::mergeRuleStatusVals() {
    //
    //  The basic outline of what happens here is this...
    //
    //    for each state in this state table
    //       if the status tag list for this state is in the global statuses list
    //           record where and
    //           continue with the next state
    //       else
    //           add the tag list for this state to the global list.
    //
    int i;
    int n;

    // Pre-set a single tag of {0} into the table.
    //   We will need this as a default, for rule sets with no explicit tagging.
    if (fRB->fRuleStatusVals->size() == 0) {
        fRB->fRuleStatusVals->addElement(1, *fStatus);  // Num of statuses in group
        fRB->fRuleStatusVals->addElement((int32_t)0, *fStatus);  //   and our single status of zero
    }

    //    For each state
    for (n=0; n<fDStates->size(); n++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
        UVector *thisStatesTagValues = sd->fTagVals;
        if (thisStatesTagValues == NULL) {
            // No tag values are explicitly associated with this state.
            //   Set the default tag value.
            sd->fTagsIdx = 0;
            continue;
        }

        // There are tag(s) associated with this state.
        //   fTagsIdx will be the index into the global tag list for this state's tag values.
        //   Initial value of -1 flags that we haven't got it set yet.
        sd->fTagsIdx = -1;
        int32_t  thisTagGroupStart = 0;   // indexes into the global rule status vals list
        int32_t  nextTagGroupStart = 0;

        // Loop runs once per group of tags in the global list
        while (nextTagGroupStart < fRB->fRuleStatusVals->size()) {
            thisTagGroupStart = nextTagGroupStart;
            nextTagGroupStart += fRB->fRuleStatusVals->elementAti(thisTagGroupStart) + 1;
            if (thisStatesTagValues->size() != fRB->fRuleStatusVals->elementAti(thisTagGroupStart)) {
                // The number of tags for this state is different from
                //    the number of tags in this group from the global list.
                //    Continue with the next group from the global list.
                continue;
            }
            // The lengths match, go ahead and compare the actual tag values
            //    between this state and the group from the global list.
            for (i=0; i<thisStatesTagValues->size(); i++) {
                if (thisStatesTagValues->elementAti(i) !=
                    fRB->fRuleStatusVals->elementAti(thisTagGroupStart + 1 + i) ) {
                    // Mismatch.
                    break;
                }
            }

            if (i == thisStatesTagValues->size()) {
                // We found a set of tag values in the global list that match
                //   those for this state.  Use them.
                sd->fTagsIdx = thisTagGroupStart;
                break;
            }
        }

        if (sd->fTagsIdx == -1) {
            // No suitable entry in the global tag list already.  Add one
            sd->fTagsIdx = fRB->fRuleStatusVals->size();
            fRB->fRuleStatusVals->addElement(thisStatesTagValues->size(), *fStatus);
            for (i=0; i<thisStatesTagValues->size(); i++) {
                fRB->fRuleStatusVals->addElement(thisStatesTagValues->elementAti(i), *fStatus);
            }
        }
    }
}